

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clog.c
# Opt level: O0

void internal_logger_long(logger *log,log_level level,char *file,size_t line,char *fmt,...)

{
  FILE *__stream;
  char in_AL;
  char *pcVar1;
  char *pcVar2;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_f8 [40];
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined4 local_48;
  undefined4 local_44;
  va_list args;
  char *fmt_local;
  size_t line_local;
  char *file_local;
  log_level level_local;
  logger *log_local;
  
  if (in_AL != '\0') {
    local_c8 = in_XMM0_Qa;
    local_b8 = in_XMM1_Qa;
    local_a8 = in_XMM2_Qa;
    local_98 = in_XMM3_Qa;
    local_88 = in_XMM4_Qa;
    local_78 = in_XMM5_Qa;
    local_68 = in_XMM6_Qa;
    local_58 = in_XMM7_Qa;
  }
  if ((log->min_level <= level) && ((log->quiet & 1U) == 0)) {
    __stream = (FILE *)log->stream;
    local_d0 = in_R9;
    args[0].reg_save_area = fmt;
    pcVar1 = generate_logging_name(log->name);
    pcVar2 = log_level_to_string(level);
    fprintf(__stream,"[%s:%s] (%s:%zu) - ",pcVar1,pcVar2,file,line);
    args[0].overflow_arg_area = local_f8;
    args[0]._0_8_ = &stack0x00000008;
    local_44 = 0x30;
    local_48 = 0x28;
    vfprintf((FILE *)log->stream,(char *)args[0].reg_save_area,&local_48);
    fputs("\n",(FILE *)log->stream);
    if ((LEVEL_WARNING < level) && (log->error_handler_func != (error_func_t)0x0)) {
      (*log->error_handler_func)(level);
    }
  }
  return;
}

Assistant:

void internal_logger_long(const struct logger *log, enum log_level level,
                          const char *file, size_t line, const char *fmt, ...)
{
        if (level < log->min_level || log->quiet) {
                return;
        }

        fprintf(log->stream,
                "[%s:%s] (%s:%zu) - ",
                generate_logging_name(log->name),
                log_level_to_string(level),
                file,
                line);

        va_list args;
        va_start(args, fmt);
        vfprintf(log->stream, fmt, args);
        va_end(args);

        fputs("\n", log->stream);

        if (level >= LEVEL_ERROR && log->error_handler_func != NULL) {
                log->error_handler_func(level);
        }
}